

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3_result_zeroblob64(sqlite3_context *pCtx,u64 n)

{
  int iVar1;
  
  if ((ulong)(long)pCtx->pOut->db->aLimit[0] < n) {
    sqlite3_result_error_toobig(pCtx);
    iVar1 = 0x12;
  }
  else {
    sqlite3VdbeMemSetZeroBlob(pCtx->pOut,(int)n);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

SQLITE_API int sqlite3_result_zeroblob64(sqlite3_context *pCtx, u64 n){
  Mem *pOut = pCtx->pOut;
  assert( sqlite3_mutex_held(pOut->db->mutex) );
  if( n>(u64)pOut->db->aLimit[SQLITE_LIMIT_LENGTH] ){
    sqlite3_result_error_toobig(pCtx);
    return SQLITE_TOOBIG;
  }
#ifndef SQLITE_OMIT_INCRBLOB
  sqlite3VdbeMemSetZeroBlob(pCtx->pOut, (int)n);
  return SQLITE_OK;
#else
  return sqlite3VdbeMemSetZeroBlob(pCtx->pOut, (int)n);
#endif
}